

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindBuffersBaseTest::iterate(FunctionalBindBuffersBaseTest *this)

{
  pointer *this_00;
  GLuint GVar1;
  code *pcVar2;
  Context *pCVar3;
  value_type vVar4;
  GLint index;
  int iVar5;
  string *psVar6;
  GLenum GVar7;
  GLenum pname;
  char cVar8;
  int iVar9;
  deUint32 dVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  reference pvVar12;
  reference pvVar13;
  TestContext *pTVar14;
  TestLog *this_01;
  MessageBuilder *pMVar15;
  TestError *this_02;
  Enum<int,_2UL> EVar16;
  GLuint local_2d4;
  undefined1 local_2d0 [4];
  GLint j_6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  GLint j_5;
  Enum<int,_2UL> local_2a0;
  GetNameFunc local_290;
  int local_288;
  Enum<int,_2UL> local_280;
  int local_26c;
  MessageBuilder local_268;
  int local_e8;
  value_type local_e4;
  GLenum generated_error;
  GLuint invalid_id;
  GLint j_4;
  GLint j_3;
  GLint j_2;
  GLint half_index;
  GLint j_1;
  GLint j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  GLintptr buffer_size;
  int local_80;
  int local_7c;
  GLint max_size;
  GLint max_buffers;
  int local_70;
  GetNameFunc local_68;
  int local_60;
  string local_58;
  string *local_38;
  string *target_name;
  GLenum target;
  GLenum pname_max_size;
  GLenum pname_max;
  GLenum pname_binding;
  size_t i;
  Functions *gl;
  FunctionalBindBuffersBaseTest *this_local;
  
  gl = (Functions *)this;
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar11->_vptr_RenderContext[3])();
  i = CONCAT44(extraout_var,iVar9);
  _pname_max = 0;
  while( true ) {
    if (3 < _pname_max) {
      pTVar14 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar14,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    pname_max_size = *(GLenum *)(s_buffer_infos + _pname_max * 0x14 + 8);
    target = *(GLenum *)(s_buffer_infos + _pname_max * 0x14 + 0xc);
    target_name._4_4_ = *(undefined4 *)(s_buffer_infos + _pname_max * 0x14 + 0x10);
    target_name._0_4_ = *(GLenum *)(s_buffer_infos + _pname_max * 0x14);
    EVar16 = glu::getBufferTargetStr((GLenum)target_name);
    _max_size = EVar16.m_getName;
    local_70 = EVar16.m_value;
    local_68 = _max_size;
    local_60 = local_70;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_68);
    local_7c = 0;
    local_80 = 0;
    local_38 = &local_58;
    (**(code **)(i + 0x868))(target,&local_7c);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x968);
    (**(code **)(i + 0x868))(target_name._4_4_,&local_80);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x96c);
    iVar9 = local_80 / local_7c;
    this_00 = &buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::vector
              ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
               this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1);
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
              ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
               this_00,(long)local_7c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,(long)local_7c);
    for (half_index = 0; GVar7 = (GLenum)target_name, iVar5 = local_7c, half_index < local_7c;
        half_index = half_index + 1) {
      pvVar12 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
                operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                            *)&buffer_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)half_index);
      MultiBind::Buffer::InitData
                (pvVar12,(this->super_TestCase).m_context,(GLenum)target_name,0x88ea,(long)iVar9,
                 (GLvoid *)0x0);
      pvVar12 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
                operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                            *)&buffer_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)half_index);
      GVar1 = pvVar12->m_id;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,
                           (long)half_index);
      *pvVar13 = GVar1;
    }
    pcVar2 = *(code **)(i + 0x58);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,0);
    (*pcVar2)(GVar7,0,iVar5,pvVar13);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x984);
    for (j_2 = 0; GVar7 = pname_max_size, psVar6 = local_38, index = j_2, j_2 < local_7c;
        j_2 = j_2 + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,(long)j_2);
      checkBinding(pCVar3,GVar7,index,psVar6,*pvVar13);
    }
    j_3 = local_7c / 2;
    (**(code **)(i + 0x58))((GLenum)target_name,0,j_3,0);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x996);
    for (j_4 = 0; j_4 < j_3; j_4 = j_4 + 1) {
      checkBinding((this->super_TestCase).m_context,pname_max_size,j_4,local_38,0);
    }
    for (invalid_id = j_3; GVar7 = pname_max_size, psVar6 = local_38, GVar1 = invalid_id,
        (int)invalid_id < local_7c; invalid_id = invalid_id + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,
                           (long)(int)invalid_id);
      checkBinding(pCVar3,GVar7,GVar1,psVar6,*pvVar13);
    }
    (**(code **)(i + 0x58))((GLenum)target_name,j_3,local_7c - j_3,0);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9a3);
    for (generated_error = 0; (int)generated_error < local_7c; generated_error = generated_error + 1
        ) {
      checkBinding((this->super_TestCase).m_context,pname_max_size,generated_error,local_38,0);
    }
    local_e4 = 1;
    while( true ) {
      cVar8 = (**(code **)(i + 0xc68))(local_e4);
      vVar4 = local_e4;
      if (cVar8 != '\x01') break;
      local_e4 = local_e4 + 1;
    }
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,0);
    GVar7 = (GLenum)target_name;
    iVar9 = local_7c;
    *pvVar13 = vVar4;
    pcVar2 = *(code **)(i + 0x58);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,0);
    (*pcVar2)(GVar7,0,iVar9,pvVar13);
    local_e8 = (**(code **)(i + 0x800))();
    if (local_e8 != 0x502) break;
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,0);
    *pvVar13 = 0;
    for (t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0; pname = pname_max_size,
        GVar7 = (GLenum)target_name, psVar6 = local_38,
        GVar1 = t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_,
        (int)t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ < local_7c;
        t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,
                           (long)(int)t_buffer_ids.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      checkBinding(pCVar3,pname,GVar1,psVar6,*pvVar13);
    }
    pcVar2 = *(code **)(i + 0x48);
    pvVar12 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
              operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          *)&buffer_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(GVar7,0,pvVar12->m_id);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"BindBufferBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d1);
    GVar7 = pname_max_size;
    psVar6 = local_38;
    pCVar3 = (this->super_TestCase).m_context;
    pvVar12 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
              operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          *)&buffer_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,0);
    checkBinding(pCVar3,GVar7,0,psVar6,pvVar12->m_id);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0,(long)local_7c);
    GVar7 = (GLenum)target_name;
    pcVar2 = *(code **)(i + 0x58);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0,0);
    (*pcVar2)(GVar7,0,1,pvVar13);
    dVar10 = (**(code **)(i + 0x800))();
    glu::checkError(dVar10,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d8);
    for (local_2d4 = 0; GVar7 = pname_max_size, psVar6 = local_38, (int)local_2d4 < local_7c;
        local_2d4 = local_2d4 + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1,
                           (long)(int)local_2d4);
      checkBinding(pCVar3,GVar7,local_2d4,psVar6,*pvVar13);
    }
    (**(code **)(i + 0x58))((GLenum)target_name,0,local_7c,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j_1);
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
               &buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    _pname_max = _pname_max + 1;
  }
  pTVar14 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(pTVar14);
  tcu::TestLog::operator<<(&local_268,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<(&local_268,(char (*) [7])0x2a28b75);
  pMVar15 = tcu::MessageBuilder::operator<<
                      (pMVar15,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      );
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [9])", line: ");
  local_26c = 0x9c0;
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_26c);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [20])". Got wrong error: ");
  EVar16 = glu::getErrorStr(local_e8);
  local_290 = EVar16.m_getName;
  local_288 = EVar16.m_value;
  local_280.m_getName = local_290;
  local_280.m_value = local_288;
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_280);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [13])0x2a14159);
  EVar16 = glu::getErrorStr(0x502);
  local_2a0.m_getName = EVar16.m_getName;
  local_2a0.m_value = EVar16.m_value;
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_2a0);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [12])", message: ");
  pMVar15 = tcu::MessageBuilder::operator<<
                      (pMVar15,(char (*) [38])"BindBufferBase with invalid buffer id");
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_268);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x9c0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindBuffersBaseTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		const GLenum	   pname_binding  = s_buffer_infos[i].m_pname_binding;
		const GLenum	   pname_max	  = s_buffer_infos[i].m_pname_max;
		const GLenum	   pname_max_size = s_buffer_infos[i].m_pname_max_size;
		const GLenum	   target		  = s_buffer_infos[i].m_target;
		const std::string& target_name	= glu::getBufferTargetStr(target).toString();

		GLint max_buffers = 0;
		GLint max_size	= 0;

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Get max size */
		gl.getIntegerv(pname_max_size, &max_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		GLintptr buffer_size = max_size / max_buffers;

		/* Storage */
		std::vector<Buffer> buffer;
		std::vector<GLuint> buffer_ids;

		buffer.resize(max_buffers);
		buffer_ids.resize(max_buffers);

		/* Prepare buffers */
		for (GLint j = 0; j < max_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
		}

		/*
		 * - execute BindBufferBase to bind all buffers to tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 *
		 * - execute BindBufferBase for first half of bindings with NULL as <buffers>
		 * to unbind first half of bindings for tested target;
		 * - inspect if bindings were modified;
		 * - execute BindBufferBase for second half of bindings with NULL as <buffers>
		 * to unbind rest of bindings;
		 * - inspect if bindings were modified;
		 */
		GLint half_index = max_buffers / 2;
		gl.bindBuffersBase(target, 0 /* first */, half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < half_index; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		for (GLint j = half_index; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		gl.bindBuffersBase(target, half_index /* first */, max_buffers - half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		/*
		 * - change <buffers> so first entry is invalid;
		 * - execute BindBufferBase to bind all buffers to tested target; It is
		 * expected that INVALID_OPERATION will be generated;
		 * - inspect if all bindings but first were modified;
		 */

		/* Find invalid id */
		GLuint invalid_id = 1;
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;

		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindBufferBase with invalid buffer id");

		/* Update buffer_ids */
		buffer_ids[0] = 0; /* 0 means unbound */

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 * - bind any buffer to first binding;
		 * - execute BindBufferBase for 0 as <first>, 1 as <count> and <buffers> filled
		 * with zeros to unbind 1st binding for tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBufferBase(target, 0, buffer[0].m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferBase");
		checkBinding(m_context, pname_binding, 0, target_name, buffer[0].m_id);

		std::vector<GLuint> t_buffer_ids;
		t_buffer_ids.resize(max_buffers);

		gl.bindBuffersBase(target, 0 /* first */, 1 /* count */, &t_buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/* - unbind all buffers. */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, 0);
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}